

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.c
# Opt level: O0

void testParse(char *cmdLine,char **refArgs,int numArgs)

{
  deBool dVar1;
  deCommandLine *cmdLine_00;
  int local_2c;
  int argNdx;
  deCommandLine *parsedCmdLine;
  int numArgs_local;
  char **refArgs_local;
  char *cmdLine_local;
  
  cmdLine_00 = deCommandLine_parse(cmdLine);
  do {
    dVar1 = deGetFalse();
    if ((dVar1 != 0) || (cmdLine_00 == (deCommandLine *)0x0)) {
      deAssertFail("parsedCmdLine",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/deutil/deCommandLine.c"
                   ,0x97);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = deGetFalse();
    if ((dVar1 != 0) || (cmdLine_00->numArgs != numArgs)) {
      deAssertFail("parsedCmdLine->numArgs == numArgs",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/deutil/deCommandLine.c"
                   ,0x98);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  for (local_2c = 0; local_2c < numArgs; local_2c = local_2c + 1) {
    do {
      dVar1 = deGetFalse();
      if ((dVar1 != 0) ||
         (dVar1 = deStringEqual(cmdLine_00->args[local_2c],refArgs[local_2c]), dVar1 == 0)) {
        deAssertFail("deStringEqual(parsedCmdLine->args[argNdx], refArgs[argNdx])",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/deutil/deCommandLine.c"
                     ,0x9b);
      }
      dVar1 = deGetFalse();
    } while (dVar1 != 0);
  }
  deCommandLine_destroy(cmdLine_00);
  return;
}

Assistant:

static void testParse (const char* cmdLine, const char* const* refArgs, int numArgs)
{
	deCommandLine*	parsedCmdLine	= deCommandLine_parse(cmdLine);
	int				argNdx;

	DE_TEST_ASSERT(parsedCmdLine);
	DE_TEST_ASSERT(parsedCmdLine->numArgs == numArgs);

	for (argNdx = 0; argNdx < numArgs; argNdx++)
		DE_TEST_ASSERT(deStringEqual(parsedCmdLine->args[argNdx], refArgs[argNdx]));

	deCommandLine_destroy(parsedCmdLine);
}